

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

hash_table_entry_t * hash_table_find(unsigned_long hash,hash_table_t *hash_table)

{
  hash_table_entry_t *local_28;
  hash_table_entry_t *entry;
  hash_table_t *hash_table_local;
  unsigned_long hash_local;
  
  local_28 = hash_table->entries + hash % hash_table->capacity;
  while( true ) {
    if (local_28 == (hash_table_entry_t *)0x0) {
      return (hash_table_entry_t *)0x0;
    }
    if ((local_28->hash == hash) && (local_28->filled != 0)) break;
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

static hash_table_entry_t* hash_table_find(unsigned long hash, hash_table_t* hash_table)
{
  hash_table_entry_t* entry = hash_table->entries + (hash % hash_table->capacity);
  while (entry)
  {
    if (entry->hash == hash && entry->filled)
    {
      return entry;
    }
    entry = entry->next;
  }
  return NULL;
}